

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O0

bool __thiscall
HawkTracer::parser::ProtocolReader::_read_numeric
          (ProtocolReader *this,FieldType *value,EventKlassField *field)

{
  uint8_t uVar1;
  int8_t iVar2;
  uint16_t uVar3;
  int16_t iVar4;
  uint uVar5;
  FieldTypeId FVar6;
  uint32_t uVar7;
  int32_t iVar8;
  pointer pSVar9;
  size_t sVar10;
  uint64_t uVar11;
  int64_t iVar12;
  uint8_t local_38;
  undefined1 uStack_37;
  undefined2 uStack_36;
  undefined4 uStack_34;
  char buff [16];
  EventKlassField *field_local;
  FieldType *value_local;
  ProtocolReader *this_local;
  
  buff._8_8_ = field;
  pSVar9 = std::
           unique_ptr<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
           ::operator->(&this->_stream);
  sVar10 = EventKlassField::get_sizeof((EventKlassField *)buff._8_8_);
  uVar5 = (*pSVar9->_vptr_Stream[3])(pSVar9,&local_38,sVar10);
  if ((uVar5 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    FVar6 = EventKlassField::get_type_id((EventKlassField *)buff._8_8_);
    switch(FVar6) {
    case UINT8:
      uVar1 = convert_endianness_to_native(local_38,this->_endianness);
      value->f_UINT8 = uVar1;
      break;
    case INT8:
      iVar2 = convert_endianness_to_native(local_38,this->_endianness);
      value->f_INT8 = iVar2;
      break;
    case UINT16:
      uVar3 = convert_endianness_to_native(CONCAT11(uStack_37,local_38),this->_endianness);
      value->f_UINT16 = uVar3;
      break;
    case INT16:
      iVar4 = convert_endianness_to_native(CONCAT11(uStack_37,local_38),this->_endianness);
      value->f_INT16 = iVar4;
      break;
    case UINT32:
      uVar7 = convert_endianness_to_native
                        (CONCAT22(uStack_36,CONCAT11(uStack_37,local_38)),this->_endianness);
      value->f_UINT32 = uVar7;
      break;
    case INT32:
      iVar8 = convert_endianness_to_native
                        (CONCAT22(uStack_36,CONCAT11(uStack_37,local_38)),this->_endianness);
      value->f_INT32 = iVar8;
      break;
    case UINT64:
      uVar11 = convert_endianness_to_native
                         (CONCAT44(uStack_34,CONCAT22(uStack_36,CONCAT11(uStack_37,local_38))),
                          this->_endianness);
      value->f_UINT64 = uVar11;
      break;
    case INT64:
      iVar12 = convert_endianness_to_native
                         (CONCAT44(uStack_34,CONCAT22(uStack_36,CONCAT11(uStack_37,local_38))),
                          this->_endianness);
      value->f_INT64 = iVar12;
      break;
    case POINTER:
      return false;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/parser/protocol_reader.cpp"
                    ,0xd0,
                    "bool HawkTracer::parser::ProtocolReader::_read_numeric(FieldType &, const EventKlassField &)"
                   );
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ProtocolReader::_read_numeric(FieldType& value, const EventKlassField& field)
{
    char buff[16];
    if (!_stream->read_data(buff, field.get_sizeof()))
    {
        return false;
    }

    switch (field.get_type_id())
    {
#define SET_VALUE(field_id, c_type) case FieldTypeId::field_id: value.f_##field_id = convert_endianness_to_native(*((c_type*)buff), _endianness); break
    SET_VALUE(UINT8, uint8_t);
    SET_VALUE(INT8, int8_t);
    SET_VALUE(UINT16, uint16_t);
    SET_VALUE(INT16, int16_t);
    SET_VALUE(UINT32, uint32_t);
    SET_VALUE(INT32, int32_t);
    SET_VALUE(UINT64, uint64_t);
    SET_VALUE(INT64, int64_t);
#undef SET_VALUE
    case FieldTypeId::POINTER:
        return false;
        break;
    default: assert(0); return false;
    }

    return true;
}